

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.test_case.cpp
# Opt level: O0

test_case * __thiscall mon::test_case::name_abi_cxx11_(test_case *this)

{
  long in_RSI;
  test_case *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x28));
  return this;
}

Assistant:

string test_case::name() const
    {
        return name_;
    }